

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

Promise<kj::AuthenticatedStream> __thiscall
kj::TlsContext::wrapServer(TlsContext *this,AuthenticatedStream *stream)

{
  SourceLocation location;
  SourceLocation location_00;
  Own<kj::AsyncIoStream,_std::nullptr_t> *params;
  TlsConnection *pTVar1;
  Timer **ppTVar2;
  PeerIdentity *pPVar3;
  Own<kj::TlsConnection,_std::nullptr_t> *other;
  Own<kj::PeerIdentity,_std::nullptr_t> *other_00;
  String *pSVar4;
  TlsContext *__addr_len;
  Own<kj::AsyncIoStream,_std::nullptr_t> *in_RDX;
  sockaddr *__addr;
  SourceLocation local_130;
  String local_118;
  Own<kj::TlsConnection,_std::nullptr_t> local_100;
  Own<kj::PeerIdentity,_std::nullptr_t> local_f0;
  undefined1 local_e0 [16];
  String peerId;
  SourceLocation local_b8;
  long local_98;
  Timer *local_90;
  Fault local_88;
  Timer *local_80;
  Timer *_kj_result;
  Promise<void> local_70;
  Promise<void> local_68;
  Quantity<long,_kj::_::NanosecondLabel> *local_60;
  Quantity<long,_kj::_::NanosecondLabel> *timeout;
  Quantity<long,_kj::_::NanosecondLabel> *_timeout962;
  undefined1 local_40 [8];
  Promise<void> promise;
  undefined1 local_30 [8];
  Own<kj::TlsConnection,_std::nullptr_t> conn;
  AuthenticatedStream *stream_local;
  TlsContext *this_local;
  
  __addr_len = this;
  params = mv<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>(in_RDX);
  promise.super_PromiseBase.node.ptr = (PromiseBase)(stream->stream).ptr;
  heap<kj::TlsConnection,kj::Own<kj::AsyncIoStream,decltype(nullptr)>,ssl_ctx_st*>
            ((kj *)local_30,params,(ssl_ctx_st **)&promise);
  pTVar1 = Own<kj::TlsConnection,_std::nullptr_t>::operator->
                     ((Own<kj::TlsConnection,_std::nullptr_t> *)local_30);
  TlsConnection::accept((TlsConnection *)local_40,(int)pTVar1,__addr,(socklen_t *)__addr_len);
  timeout = kj::_::readMaybe<kj::Quantity<long,kj::_::NanosecondLabel>>
                      ((Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *)
                       &(stream->peerIdentity).ptr);
  if (timeout != (Quantity<long,_kj::_::NanosecondLabel> *)0x0) {
    local_60 = timeout;
    local_80 = kj::_::readMaybe<kj::Timer>((Maybe<kj::Timer_&> *)&stream->peerIdentity);
    if (local_80 == (Timer *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                 ,0x3c3,FAILED,"timer != nullptr","");
      kj::_::Debug::Fault::fatal(&local_88);
    }
    ppTVar2 = mv<kj::Timer*>(&local_80);
    local_90 = *ppTVar2;
    local_98 = local_60->value;
    (*(local_90->super_MonotonicClock)._vptr_MonotonicClock[2])(&_kj_result,local_90,local_98);
    Promise<void>::then<kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__0>
              (&local_70,(Type *)&_kj_result);
    mv<kj::Promise<void>>((Promise<void> *)local_40);
    SourceLocation::SourceLocation
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
               ,"wrapServer",0x3c3,0x27);
    location.function = local_b8.function;
    location.fileName = local_b8.fileName;
    location.lineNumber = local_b8.lineNumber;
    location.columnNumber = local_b8.columnNumber;
    Promise<void>::exclusiveJoin(&local_68,&local_70,location);
    Promise<void>::operator=((Promise<void> *)local_40,&local_68);
    Promise<void>::~Promise(&local_68);
    Promise<void>::~Promise(&local_70);
    Promise<void>::~Promise((Promise<void> *)&_kj_result);
  }
  pPVar3 = Own<kj::PeerIdentity,_std::nullptr_t>::operator->
                     ((Own<kj::PeerIdentity,_std::nullptr_t> *)(in_RDX + 1));
  (**pPVar3->_vptr_PeerIdentity)(local_e0 + 8);
  other = mv<kj::Own<kj::TlsConnection,decltype(nullptr)>>
                    ((Own<kj::TlsConnection,_std::nullptr_t> *)local_30);
  Own<kj::TlsConnection,_std::nullptr_t>::Own(&local_100,other);
  other_00 = mv<kj::Own<kj::PeerIdentity,decltype(nullptr)>>
                       ((Own<kj::PeerIdentity,_std::nullptr_t> *)(in_RDX + 1));
  Own<kj::PeerIdentity,_std::nullptr_t>::Own(&local_f0,other_00);
  Promise<void>::then<kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__1>
            ((Promise<void> *)local_e0,(Type *)local_40);
  pSVar4 = mv<kj::String>((String *)(local_e0 + 8));
  String::String(&local_118,pSVar4);
  SourceLocation::SourceLocation
            (&local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
             ,"wrapServer",0x3c8,10);
  location_00.function = local_130.function;
  location_00.fileName = local_130.fileName;
  location_00.lineNumber = local_130.lineNumber;
  location_00.columnNumber = local_130.columnNumber;
  Promise<kj::AuthenticatedStream>::catch_<kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__2>
            ((Promise<kj::AuthenticatedStream> *)this,(Type *)local_e0,location_00);
  wrapServer(kj::AuthenticatedStream)::$_2::~__2((__2 *)&local_118);
  Promise<kj::AuthenticatedStream>::~Promise((Promise<kj::AuthenticatedStream> *)local_e0);
  wrapServer(kj::AuthenticatedStream)::$_1::~__1((__1 *)&local_100);
  String::~String((String *)(local_e0 + 8));
  Promise<void>::~Promise((Promise<void> *)local_40);
  Own<kj::TlsConnection,_std::nullptr_t>::~Own((Own<kj::TlsConnection,_std::nullptr_t> *)local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::AuthenticatedStream> TlsContext::wrapServer(kj::AuthenticatedStream stream) {
  auto conn = kj::heap<TlsConnection>(kj::mv(stream.stream), reinterpret_cast<SSL_CTX*>(ctx));
  auto promise = conn->accept();
  KJ_IF_SOME(timeout, acceptTimeout) {
    promise = KJ_REQUIRE_NONNULL(timer).afterDelay(timeout).then([]() -> kj::Promise<void> {
      return KJ_EXCEPTION(DISCONNECTED, "timed out waiting for client during TLS handshake");
    }).exclusiveJoin(kj::mv(promise));
  }
  auto peerId = stream.peerIdentity->toString();
  return promise.then([conn=kj::mv(conn),innerId=kj::mv(stream.peerIdentity)]() mutable {
    auto id = conn->getIdentity(kj::mv(innerId));
    return kj::AuthenticatedStream { kj::mv(conn), kj::mv(id) };
  }).catch_([peerId=kj::mv(peerId)](kj::Exception&& e) -> kj::Promise<kj::AuthenticatedStream> {
    e.setDescription(kj::str(e.getDescription(), "; clientId = ", peerId));
    kj::throwFatalException(kj::mv(e));
  });
}